

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O0

void lesshungry(int num)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  obj *local_18;
  boolean iseating;
  int num_local;
  
  u.uhunger = num + u.uhunger;
  if (u.uhunger < 2000) {
    if ((0x5db < u.uhunger) &&
       ((((byte)victual._20_1_ >> 2 & 1) == 0 ||
        ((((byte)victual._20_1_ >> 2 & 1) != 0 && (((byte)victual._20_1_ >> 1 & 1) == 0)))))) {
      pline("You\'re having a hard time getting all of it down.");
      nomovemsg = "You\'re finally finished.";
      if (((byte)victual._20_1_ >> 2 & 1) == 0) {
        multi = -2;
      }
      else {
        bVar2 = victual._20_1_ & 0xfd | 2;
        bVar1 = victual._20_1_ & 1;
        victual._20_1_ = bVar2;
        if (((bVar1 != 0) && (1 < victual.reqtime)) &&
           (cVar3 = yn_function("Stop eating?","yn",'y'), cVar3 == 'y')) {
          reset_eat();
          nomovemsg = (char *)0x0;
        }
      }
    }
  }
  else if ((occupation != eatfood && force_save_hs == '\0') || ((victual._20_1_ & 1) != 0)) {
    if (occupation != eatfood && force_save_hs == '\0') {
      if (occupation == opentin) {
        local_18 = tin.tin;
      }
      else {
        local_18 = (obj *)0x0;
      }
      choke(local_18);
    }
    else {
      choke(victual.piece);
      reset_eat();
    }
  }
  newuhs('\0');
  return;
}

Assistant:

void lesshungry(int num)
{
	/* See comments in newuhs() for discussion on force_save_hs */
	boolean iseating = (occupation == eatfood) || force_save_hs;

	u.uhunger += num;
	if (u.uhunger >= 2000) {
	    if (!iseating || victual.canchoke) {
		if (iseating) {
		    choke(victual.piece);
		    reset_eat();
		} else
		    choke(occupation == opentin ? tin.tin : NULL);
		/* no reset_eat() */
	    }
	} else {
	    /* Have lesshungry() report when you're nearly full so all eating
	     * warns when you're about to choke.
	     */
	    if (u.uhunger >= 1500) {
		if (!victual.eating || (victual.eating && !victual.fullwarn)) {
		    pline("You're having a hard time getting all of it down.");
		    nomovemsg = "You're finally finished.";
		    if (!victual.eating)
			multi = -2;
		    else {
			victual.fullwarn = TRUE;
			if (victual.canchoke && victual.reqtime > 1) {
			    /* a one-gulp food will not survive a stop */
			    if (yn_function("Stop eating?",ynchars,'y')=='y') {
				reset_eat();
				nomovemsg = NULL;
			    }
			}
		    }
		}
	    }
	}
	newuhs(FALSE);
}